

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS ref_search_create(REF_SEARCH *ref_search_ptr,REF_INT n)

{
  REF_SEARCH pRVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  
  pRVar1 = (REF_SEARCH)malloc(0x40);
  *ref_search_ptr = pRVar1;
  if (pRVar1 == (REF_SEARCH)0x0) {
    pcVar5 = "malloc *ref_search_ptr of REF_SEARCH_STRUCT NULL";
    uVar4 = 0x22;
    goto LAB_001eb498;
  }
  pRVar1->d = 3;
  pRVar1->n = n;
  pRVar1->empty = 0;
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x29,
           "ref_search_create","malloc ref_search->item of REF_INT negative");
    return 1;
  }
  sVar6 = (ulong)(uint)n * 4;
  pRVar2 = (REF_INT *)malloc(sVar6);
  pRVar1->item = pRVar2;
  if (pRVar2 == (REF_INT *)0x0) {
    pcVar5 = "malloc ref_search->item of REF_INT NULL";
    uVar4 = 0x29;
    goto LAB_001eb498;
  }
  if (n == 0) {
    pRVar2 = (REF_INT *)malloc(sVar6);
    pRVar1->left = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) goto LAB_001eb3e8;
    pRVar2 = (REF_INT *)malloc(sVar6);
    pRVar1->right = pRVar2;
    if (pRVar2 != (REF_INT *)0x0) goto LAB_001eb385;
  }
  else {
    memset(pRVar2,0xff,sVar6);
    pRVar2 = (REF_INT *)malloc(sVar6);
    pRVar1->left = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) {
LAB_001eb3e8:
      pcVar5 = "malloc ref_search->left of REF_INT NULL";
      uVar4 = 0x2a;
      goto LAB_001eb498;
    }
    memset(pRVar2,0xff,sVar6);
    pRVar2 = (REF_INT *)malloc(sVar6);
    pRVar1->right = pRVar2;
    if (pRVar2 != (REF_INT *)0x0) {
      memset(pRVar2,0xff,sVar6);
LAB_001eb385:
      pRVar3 = (REF_DBL *)malloc((ulong)(uint)(n * 3) << 3);
      pRVar1->pos = pRVar3;
      if (pRVar3 == (REF_DBL *)0x0) {
        pcVar5 = "malloc ref_search->pos of REF_DBL NULL";
        uVar4 = 0x2d;
      }
      else {
        sVar6 = (ulong)(uint)n << 3;
        pRVar3 = (REF_DBL *)malloc(sVar6);
        pRVar1->radius = pRVar3;
        if (pRVar3 == (REF_DBL *)0x0) {
          pcVar5 = "malloc ref_search->radius of REF_DBL NULL";
          uVar4 = 0x2e;
        }
        else {
          pRVar3 = (REF_DBL *)malloc(sVar6);
          pRVar1->children_ball = pRVar3;
          if (pRVar3 != (REF_DBL *)0x0) {
            if (n != 0) {
              memset(pRVar3,0,sVar6);
              return 0;
            }
            return 0;
          }
          pcVar5 = "malloc ref_search->children_ball of REF_DBL NULL";
          uVar4 = 0x2f;
        }
      }
      goto LAB_001eb498;
    }
  }
  pcVar5 = "malloc ref_search->right of REF_INT NULL";
  uVar4 = 0x2b;
LAB_001eb498:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar4,
         "ref_search_create",pcVar5);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_search_create(REF_SEARCH *ref_search_ptr, REF_INT n) {
  REF_SEARCH ref_search;

  ref_malloc(*ref_search_ptr, 1, REF_SEARCH_STRUCT);
  ref_search = (*ref_search_ptr);

  ref_search->d = 3;
  ref_search->n = n;
  ref_search->empty = 0;

  ref_malloc_init(ref_search->item, ref_search->n, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_search->left, ref_search->n, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_search->right, ref_search->n, REF_INT, REF_EMPTY);

  ref_malloc(ref_search->pos, ref_search->d * ref_search->n, REF_DBL);
  ref_malloc(ref_search->radius, ref_search->n, REF_DBL);
  ref_malloc_init(ref_search->children_ball, ref_search->n, REF_DBL, 0.0);

  return REF_SUCCESS;
}